

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall pfederc::TraitImplExpr::~TraitImplExpr(TraitImplExpr *this)

{
  TraitImplExpr *this_local;
  
  std::__cxx11::
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ::~list(&this->functions);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&this->implTrait)
  ;
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector(&this->templs);
  Capable::~Capable(&this->super_Capable);
  Expr::~Expr(&this->super_Expr);
  return;
}

Assistant:

TraitImplExpr::~TraitImplExpr() {
}